

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  Type_Info *this;
  Type_Info *ti;
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint extraout_EAX;
  long lVar12;
  long lVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar15;
  byte bVar16;
  uint local_54;
  
  peVar1 = (lhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = __dynamic_cast(peVar1,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,
                            &chaiscript::dispatch::Dynamic_Proxy_Function::typeinfo,0);
  }
  if (lVar12 == 0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar12 = 0;
  }
  else {
    this_01 = (lhs->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  peVar1 = (rhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar13 = 0;
  }
  else {
    lVar13 = __dynamic_cast(peVar1,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,
                            &chaiscript::dispatch::Dynamic_Proxy_Function::typeinfo,0);
  }
  if (lVar13 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar13 = 0;
  }
  else {
    this_00 = (rhs->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  if (lVar13 == 0 || lVar12 == 0) {
    if (lVar12 == 0 || lVar13 != 0) {
      bVar16 = 1;
      if (lVar12 != 0 || lVar13 == 0) {
        peVar1 = (lhs->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        peVar4 = (rhs->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        pTVar5 = (peVar1->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pTVar6 = (peVar1->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar7 = (peVar4->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pTVar8 = (peVar4->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
            ::boxed_type == '\0') {
          function_less_than();
        }
        uVar14 = ((long)pTVar5 - (long)pTVar6 >> 3) * -0x5555555555555555;
        uVar15 = ((long)pTVar7 - (long)pTVar8 >> 3) * -0x5555555555555555;
        local_54 = (uint)function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                         ::boxed_pod_type;
        if (function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
            ::boxed_pod_type == 0) {
          function_less_than();
          local_54 = extraout_EAX;
        }
        if (uVar14 < uVar15) {
          uVar15 = uVar14;
        }
        if (1 < uVar15) {
          lVar13 = uVar15 - 1;
          lVar12 = 0x18;
          do {
            pTVar5 = (peVar1->m_types).
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            this = (Type_Info *)((long)&pTVar5->m_type_info + lVar12);
            pTVar6 = (peVar4->m_types).
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ti = (Type_Info *)((long)&pTVar6->m_type_info + lVar12);
            bVar9 = Type_Info::bare_equal(this,ti);
            if ((!bVar9) ||
               (bVar9 = true,
               (*(byte *)((long)&pTVar5->m_flags + lVar12) & 1) !=
               (*(byte *)((long)&pTVar6->m_flags + lVar12) & 1))) {
              bVar9 = Type_Info::bare_equal(this,ti);
              if ((bVar9) &&
                 (((*(byte *)((long)&pTVar5->m_flags + lVar12) & 1) != 0 &&
                  ((*(byte *)((long)&pTVar6->m_flags + lVar12) & 1) == 0)))) {
LAB_0018b314:
                bVar9 = false;
                local_54 = 0;
              }
              else {
                bVar9 = Type_Info::bare_equal(this,ti);
                if ((bVar9) && ((*(byte *)((long)&pTVar5->m_flags + lVar12) & 1) == 0)) {
LAB_0018b35e:
                  local_54 = 1;
                }
                else {
                  bVar9 = Type_Info::bare_equal(this,&function_less_than::boxed_type);
                  if (bVar9) goto LAB_0018b314;
                  bVar10 = Type_Info::bare_equal(ti,&function_less_than::boxed_type);
                  bVar11 = Type_Info::bare_equal(this,&function_less_than::boxed_pod_type);
                  bVar9 = false;
                  local_54 = (uint)bVar10;
                  if ((bVar10) || (bVar11)) goto LAB_0018b373;
                  bVar9 = Type_Info::bare_equal(ti,&function_less_than::boxed_pod_type);
                  if (bVar9) goto LAB_0018b35e;
                  local_54 = (uint)(this->m_type_info < ti->m_type_info);
                }
                bVar9 = false;
              }
            }
LAB_0018b373:
            if (!bVar9) {
              bVar16 = (byte)local_54;
              goto LAB_0018b3e6;
            }
            lVar12 = lVar12 + 0x18;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        bVar16 = 0;
      }
    }
    else {
      bVar16 = 0;
    }
  }
  else {
    lVar2 = *(long *)(lVar12 + 0x60);
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar12 + 0x68);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (lVar2 == 0) {
      bVar16 = 0;
    }
    else {
      lVar12 = *(long *)(lVar13 + 0x60);
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar13 + 0x68);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      bVar16 = lVar12 == 0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
  }
LAB_0018b3e6:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return (bool)(bVar16 & 1);
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs)
        {

          auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
          auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

          if (dynamic_lhs && dynamic_rhs)
          {
            if (dynamic_lhs->get_guard())
            {
              return dynamic_rhs->get_guard() ? false : true;
            } else {
              return false;
            }
          }

          if (dynamic_lhs && !dynamic_rhs)
          {
            return false;
          }

          if (!dynamic_lhs && dynamic_rhs)
          {
            return true;
          }

          const auto &lhsparamtypes = lhs->get_param_types();
          const auto &rhsparamtypes = rhs->get_param_types();

          const auto lhssize = lhsparamtypes.size();
          const auto rhssize = rhsparamtypes.size();

#ifdef CHAISCRIPT_HAS_MAGIC_STATICS
          static auto boxed_type = user_type<Boxed_Value>();
          static auto boxed_pod_type = user_type<Boxed_Number>();
#else
          auto boxed_type = user_type<Boxed_Value>();
          auto boxed_pod_type = user_type<Boxed_Number>();
#endif

          for (size_t i = 1; i < lhssize && i < rhssize; ++i)
          {
            const Type_Info &lt = lhsparamtypes[i];
            const Type_Info &rt = rhsparamtypes[i];

            if (lt.bare_equal(rt) && lt.is_const() == rt.is_const())
            {
              continue; // The first two types are essentially the same, next iteration
            }

            // const is after non-const for the same type
            if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const())
            {
              return false;
            }

            if (lt.bare_equal(rt) && !lt.is_const())
            {
              return true;
            }

            // boxed_values are sorted last
            if (lt.bare_equal(boxed_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_type))
            {
              if (lt.bare_equal(boxed_pod_type))
              {
                return true;
              }
              return true;
            }

            if (lt.bare_equal(boxed_pod_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_pod_type))
            {
              return true;
            }

            // otherwise, we want to sort by typeid
            return lt < rt;
          }

          return false;
        }